

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlCheckEntityInAttValue(xmlParserCtxtPtr ctxt,xmlEntityPtr pent,int depth)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *name;
  xmlEntityPtr pent_00;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  xmlChar *str;
  xmlChar *local_38;
  
  iVar2 = 0x28;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    iVar2 = 0x14;
  }
  if (depth < iVar2) {
    if ((pent->flags & 8) != 0) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      xmlHaltParser(ctxt);
      return;
    }
    uVar4 = (ulong)pent->length;
    uVar5 = (uint)(ctxt->inSubset == 0) * 2 + 4;
    local_38 = pent->content;
    if ((local_38 != (xmlChar *)0x0) && (ctxt->disableSAX < 2)) {
      do {
        xVar1 = *local_38;
        if (xVar1 == '&') {
          if (local_38[1] == '#') {
            iVar2 = xmlParseStringCharRef(ctxt,&local_38);
            if (iVar2 == 0) {
              *pent->content = '\0';
              break;
            }
          }
          else {
            name = xmlParseStringEntityRef(ctxt,&local_38);
            if (name == (xmlChar *)0x0) {
              *pent->content = '\0';
            }
            else {
              pent_00 = xmlLookupGeneralEntity(ctxt,name,1);
              (*xmlFree)(name);
              if ((pent_00 != (xmlEntityPtr)0x0) &&
                 (pent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
                if ((uVar5 & ~pent_00->flags) != 0) {
                  *(byte *)&pent->flags = (byte)pent->flags | 8;
                  xmlCheckEntityInAttValue(ctxt,pent_00,depth + 1);
                  *(byte *)&pent->flags = (byte)pent->flags & 0xf7;
                }
                uVar3 = 0xffffffffffffffff;
                if (!CARRY8(uVar4,pent_00->expandedSize)) {
                  uVar3 = uVar4 + pent_00->expandedSize;
                }
                uVar4 = 0xffffffffffffffff;
                if (uVar3 < 0xffffffffffffffec) {
                  uVar4 = uVar3 + 0x14;
                }
              }
            }
            if (name == (xmlChar *)0x0) break;
          }
        }
        else {
          if (xVar1 == '<') {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_LT_IN_ATTRIBUTE,XML_ERR_FATAL,
                       pent->name,(xmlChar *)0x0,(xmlChar *)0x0,0,
                       "\'<\' in entity \'%s\' is not allowed in attributes values\n",pent->name);
          }
          else if (xVar1 == '\0') break;
          local_38 = local_38 + 1;
        }
      } while (ctxt->disableSAX < 2);
    }
    if (ctxt->inSubset == 0) {
      pent->expandedSize = uVar4;
    }
    pent->flags = pent->flags | uVar5;
  }
  else {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Maximum entity nesting depth exceeded");
  }
  return;
}

Assistant:

static void
xmlCheckEntityInAttValue(xmlParserCtxtPtr ctxt, xmlEntityPtr pent, int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    const xmlChar *str;
    unsigned long expandedSize = pent->length;
    int c, flags;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    if (pent->flags & XML_ENT_EXPANDING) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
        xmlHaltParser(ctxt);
        return;
    }

    /*
     * If we're parsing a default attribute value in DTD content,
     * the entity might reference other entities which weren't
     * defined yet, so the check isn't reliable.
     */
    if (ctxt->inSubset == 0)
        flags = XML_ENT_CHECKED | XML_ENT_VALIDATED;
    else
        flags = XML_ENT_VALIDATED;

    str = pent->content;
    if (str == NULL)
        goto done;

    /*
     * Note that entity values are already validated. We only check
     * for illegal less-than signs and compute the expanded size
     * of the entity. No special handling for multi-byte characters
     * is needed.
     */
    while (!PARSER_STOPPED(ctxt)) {
        c = *str;

	if (c != '&') {
            if (c == 0)
                break;

            if (c == '<')
                xmlFatalErrMsgStr(ctxt, XML_ERR_LT_IN_ATTRIBUTE,
                        "'<' in entity '%s' is not allowed in attributes "
                        "values\n", pent->name);

            str += 1;
        } else if (str[1] == '#') {
            int val;

	    val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0) {
                pent->content[0] = 0;
                break;
            }
	} else {
            xmlChar *name;
            xmlEntityPtr ent;

	    name = xmlParseStringEntityRef(ctxt, &str);
	    if (name == NULL) {
                pent->content[0] = 0;
                break;
            }

            ent = xmlLookupGeneralEntity(ctxt, name, /* inAttr */ 1);
            xmlFree(name);

            if ((ent != NULL) &&
                (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
                if ((ent->flags & flags) != flags) {
                    pent->flags |= XML_ENT_EXPANDING;
                    xmlCheckEntityInAttValue(ctxt, ent, depth);
                    pent->flags &= ~XML_ENT_EXPANDING;
                }

                xmlSaturatedAdd(&expandedSize, ent->expandedSize);
                xmlSaturatedAdd(&expandedSize, XML_ENT_FIXED_COST);
            }
        }
    }

done:
    if (ctxt->inSubset == 0)
        pent->expandedSize = expandedSize;

    pent->flags |= flags;
}